

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.cpp
# Opt level: O0

void * RoboteqThread(void *pParam)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  char local_c58 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_a4c;
  char local_a48 [4];
  int i;
  char szCfgFilePath [256];
  int local_938;
  int deviceid;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  int res;
  double thrust2;
  double thrust1;
  double thrust;
  double rudder;
  ROBOTEQ roboteq;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  chrono_period.Suspended = 0;
  deviceid = 100;
  local_938 = 0;
  iVar3 = (int)pParam;
  roboteq._2216_8_ = pParam;
  sprintf(local_a48,"Roboteq%d.txt",(ulong)pParam & 0xffffffff);
  memset(&rudder,0,0x8b0);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      mSleep((long)deviceid);
      if (bPauseRoboteq[iVar3] == 0) break;
      if (chrono_period.Suspended != 0) {
        printf("Roboteq paused.\n");
        chrono_period.Suspended = 0;
        DisconnectRoboteq((ROBOTEQ *)&rudder);
      }
      if (bExit != 0) goto LAB_001bb8b3;
      mSleep(100);
    }
    if (bRestartRoboteq[iVar3] != 0) {
      if (chrono_period.Suspended != 0) {
        printf("Restarting a Roboteq.\n");
        chrono_period.Suspended = 0;
        DisconnectRoboteq((ROBOTEQ *)&rudder);
      }
      bRestartRoboteq[iVar3] = 0;
    }
    if (chrono_period.Suspended == 0) {
      iVar4 = ConnectRoboteq((ROBOTEQ *)&rudder,local_a48);
      if (iVar4 == 0) {
        chrono_period.Suspended = 1;
        deviceid = roboteq.BaudRate;
        EnterCriticalSection(&StateVariablesCS);
        if (roboteq.rightthrusterchan == -1) {
          vbat1_filtered = 0.0;
          vbat1_threshold = 0.0;
        }
        else {
          vbat1_filtered = roboteq.analoginputoffset[(long)roboteq.rightthrusterchan + 7];
          vbat1_threshold = roboteq.analoginputoffset[(long)roboteq.rightthrusterchan + 7];
        }
        if (roboteq.leftthrusterchan == -1) {
          ibat1_filtered = 0.0;
        }
        else {
          ibat1_filtered = roboteq.analoginputoffset[(long)roboteq.leftthrusterchan + 7];
        }
        if (roboteq.vbat1analoginputchan == -1) {
          vbat2_filtered = 0.0;
          vbat2_threshold = 0.0;
        }
        else {
          vbat2_filtered = roboteq.analoginputoffset[(long)roboteq.vbat1analoginputchan + 7];
          vbat2_threshold = roboteq.analoginputoffset[(long)roboteq.vbat1analoginputchan + 7];
        }
        if (roboteq.ibat1analoginputchan == -1) {
          ibat2_filtered = 0.0;
        }
        else {
          ibat2_filtered = roboteq.analoginputoffset[(long)roboteq.ibat1analoginputchan + 7];
        }
        vswitchcoef = roboteq.analoginputthreshold[(long)roboteq.vbat3analoginputchan + 7];
        vswitchthreshold = roboteq.analoginputoffset[(long)roboteq.vbat3analoginputchan + 7];
        LeaveCriticalSection(&StateVariablesCS);
        if (roboteq.RS232Port._784_8_ != 0) {
          fclose((FILE *)roboteq.RS232Port._784_8_);
          roboteq.RS232Port.DevType = 0;
          roboteq.RS232Port._788_4_ = 0;
        }
        if ((roboteq.timeout != 0) && (roboteq.RS232Port._784_8_ == 0)) {
          sVar5 = strlen((char *)(roboteq.LastAIs + 6));
          if (sVar5 == 0) {
            sprintf(local_c58,"Roboteq");
          }
          else {
            sprintf(local_c58,"%.127s",roboteq.LastAIs + 6);
          }
          sVar5 = strlen(local_c58);
          local_a4c = (int)sVar5;
          do {
            local_a4c = local_a4c + -1;
            if (local_a4c < 0) break;
          } while (local_c58[local_a4c] != '.');
          if ((0 < local_a4c) && (sVar5 = strlen(local_c58), local_a4c < (int)sVar5)) {
            sVar5 = strlen(local_c58);
            memset(local_c58 + local_a4c,0,sVar5 - (long)local_a4c);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar6 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_c58,pcVar6);
          LeaveCriticalSection(&strtimeCS);
          roboteq.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)roboteq.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create Roboteq data file.\n");
            goto LAB_001bb8b3;
          }
        }
      }
      else {
        chrono_period.Suspended = 0;
        mSleep(1000);
      }
    }
    else {
      chrono_period._68_4_ = 0;
      if ((robid == 0x200) ||
         (((((robid != 0x1000 && (robid != 0x2000)) && (robid != 0x4000)) && (robid != 0x8000)) &&
          ((robid == 0x20000 || ((robid != 0x100000 && (robid != 0x200000)))))))) {
        EnterCriticalSection(&StateVariablesCS);
        dVar2 = u2;
        dVar1 = u1;
        LeaveCriticalSection(&StateVariablesCS);
        chrono_period._68_4_ = SetThrustersRoboteq((ROBOTEQ *)&rudder,dVar1,dVar2);
      }
      else {
        EnterCriticalSection(&StateVariablesCS);
        dVar2 = uw_f;
        dVar1 = u_f;
        LeaveCriticalSection(&StateVariablesCS);
        chrono_period._68_4_ = Set2ActuatorsRoboteq((ROBOTEQ *)&rudder,dVar2,dVar1);
      }
      if (chrono_period._68_4_ != 0) {
        printf("Connection to a Roboteq lost.\n");
        chrono_period.Suspended = 0;
        DisconnectRoboteq((ROBOTEQ *)&rudder);
      }
    }
    if (((chrono_period.Suspended == 0) && (local_938 = local_938 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_938)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001bb8b3:
      SetThrustersRoboteq((ROBOTEQ *)&rudder,0.0,0.0);
      mSleep((long)deviceid);
      StopChronoQuick((CHRONO *)&errcount);
      if (roboteq.RS232Port._784_8_ != 0) {
        fclose((FILE *)roboteq.RS232Port._784_8_);
        roboteq.RS232Port.DevType = 0;
        roboteq.RS232Port._788_4_ = 0;
      }
      if (chrono_period.Suspended != 0) {
        DisconnectRoboteq((ROBOTEQ *)&rudder);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE RoboteqThread(void* pParam)
{
	ROBOTEQ roboteq;
	double rudder = 0, thrust = 0, thrust1 = 0, thrust2 = 0;
	//int counter = 0, counter_modulo = 0;
	int res = EXIT_SUCCESS;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 100;
	int errcount = 0;
	int deviceid = (int)(intptr_t)pParam;
	char szCfgFilePath[256];
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	sprintf(szCfgFilePath, "Roboteq%d.txt", deviceid);

	memset(&roboteq, 0, sizeof(ROBOTEQ));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Roboteq paused.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartRoboteq[deviceid])
		{
			if (bConnected)
			{
				printf("Restarting a Roboteq.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
			bRestartRoboteq[deviceid] = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectRoboteq(&roboteq, szCfgFilePath) == EXIT_SUCCESS)
			{
				bConnected = TRUE;
				threadperiod = roboteq.threadperiod;

				EnterCriticalSection(&StateVariablesCS);

				if (roboteq.vbat1analoginputchan != -1) vbat1_filtered = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_filtered = 0;
				if (roboteq.vbat1analoginputchan != -1) vbat1_threshold = roboteq.analoginputthreshold[roboteq.vbat1analoginputchan]; else vbat1_threshold = 0;
				if (roboteq.ibat1analoginputchan != -1) ibat1_filtered = roboteq.analoginputthreshold[roboteq.ibat1analoginputchan]; else ibat1_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_filtered = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_filtered = 0;
				if (roboteq.vbat2analoginputchan != -1) vbat2_threshold = roboteq.analoginputthreshold[roboteq.vbat2analoginputchan]; else vbat2_threshold = 0;
				if (roboteq.ibat2analoginputchan != -1) ibat2_filtered = roboteq.analoginputthreshold[roboteq.ibat2analoginputchan]; else ibat2_filtered = 0;
				vswitchcoef = roboteq.analoginputcoef[roboteq.switchanaloginputchan];
				vswitchthreshold = roboteq.analoginputthreshold[roboteq.switchanaloginputchan];

				LeaveCriticalSection(&StateVariablesCS);

				if (roboteq.pfSaveFile != NULL)
				{
					fclose(roboteq.pfSaveFile);
					roboteq.pfSaveFile = NULL;
				}
				if ((roboteq.bSaveRawData)&&(roboteq.pfSaveFile == NULL))
				{
					if (strlen(roboteq.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", roboteq.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "Roboteq");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					roboteq.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (roboteq.pfSaveFile == NULL)
					{
						printf("Unable to create Roboteq data file.\n");
						break;
					}
				}
			}
			else
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			res = EXIT_SUCCESS;

			switch (robid)
			{
			case BUGGY_SIMULATOR_ROBID:
			case BUGGY_ROBID:
			case SAILBOAT_SIMULATOR_ROBID:
			case VAIMOS_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudder = uw_f;
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				res = Set2ActuatorsRoboteq(&roboteq, rudder, thrust);
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				res = SetThrustersRoboteq(&roboteq, thrust1, thrust2);
				break;
			}

			if (res != EXIT_SUCCESS)
			{
				printf("Connection to a Roboteq lost.\n");
				bConnected = FALSE;
				DisconnectRoboteq(&roboteq);
			}
		}

		//printf("RoboteqThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersRoboteq(&roboteq, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (roboteq.pfSaveFile != NULL)
	{
		fclose(roboteq.pfSaveFile);
		roboteq.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectRoboteq(&roboteq);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}